

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O3

HPDF_REAL HPDF_Page_GetHorizontalScalling(HPDF_Page page)

{
  HPDF_REAL HVar1;
  
  HVar1 = 100.0;
  if (((page != (HPDF_Page)0x0) && (page->attr != (void *)0x0)) &&
     ((page->header).obj_class == 0x411)) {
    HVar1 = *(HPDF_REAL *)(*(long *)((long)page->attr + 0x28) + 0x5c);
  }
  return HVar1;
}

Assistant:

HPDF_EXPORT(HPDF_REAL)
HPDF_Page_GetHorizontalScalling  (HPDF_Page   page)
{
    HPDF_PTRACE((" HPDF_Page_GetHorizontalScalling\n"));

    if (HPDF_Page_Validate (page)) {
        HPDF_PageAttr attr = (HPDF_PageAttr)page->attr;

        return attr->gstate->h_scalling;
    } else
        return HPDF_DEF_HSCALING;
}